

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

DispatchCallResult __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::dispatchCall
          (TestNoTailForwarder *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 *puVar2;
  PromiseArena *pPVar3;
  PointerReader other;
  SegmentBuilder *pSVar4;
  WirePointer *pWVar5;
  Disposer *pDVar6;
  RequestHook *pRVar7;
  void *pvVar8;
  size_t __n;
  undefined6 in_register_00000012;
  void *__buf;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int __flags;
  undefined8 *in_R8;
  TransformPromiseNodeBase *this_00;
  DispatchCallResult DVar11;
  MessageSizeCounts MVar12;
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  Request<capnp::AnyPointer,_capnp::AnyPointer> req;
  Reader params;
  Request<capnp::AnyPointer,_capnp::AnyPointer> local_d0;
  undefined8 *local_a8;
  PromiseBase local_a0;
  PointerBuilder local_98;
  Disposer *pDStack_80;
  RequestHook *local_78;
  undefined1 local_68 [8];
  WordCountN<61,_uint64_t> local_60;
  uint local_58;
  PointerReader local_50;
  undefined8 uVar9;
  undefined1 *puVar10;
  
  if ((int)context.hook == 3 && CONCAT62(in_register_00000012,methodId) == -0x2238f40687becc31) {
    DVar11 = capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCall
                       (&this->super_Server,interfaceId,methodId,
                        (CallContextHook *)((ulong)context.hook & 0xffff));
    uVar9 = DVar11._8_8_;
  }
  else {
    local_a0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
    (**(code **)*in_R8)(&local_50);
    lVar1 = *(long *)(*(long *)(interfaceId + 8) + -0x18);
    MVar12 = PointerReader::targetSize(&local_50);
    local_60 = MVar12.wordCount;
    puVar2 = *(undefined8 **)(interfaceId + 0x10 + lVar1);
    puVar10 = local_68;
    local_68[0] = 1;
    local_58 = MVar12.capCount;
    __n = (ulong)context.hook & 0xffff;
    (**(code **)*puVar2)(&local_d0,puVar2,CONCAT62(in_register_00000012,methodId),__n,puVar10,0);
    __flags = (int)puVar10;
    local_98.segment = local_d0.super_Builder.builder.segment;
    local_98.capTable = local_d0.super_Builder.builder.capTable;
    local_98.pointer = local_d0.super_Builder.builder.pointer;
    pDStack_80 = local_d0.hook.disposer;
    local_78 = local_d0.hook.ptr;
    other.capTable = local_50.capTable;
    other.segment = local_50.segment;
    other.pointer = local_50.pointer;
    other.nestingLimit = local_50.nestingLimit;
    other._28_4_ = local_50._28_4_;
    PointerBuilder::copyFrom(&local_98,other,false);
    Request<capnp::AnyPointer,_capnp::AnyPointer>::send(&local_d0,(int)&local_98,__buf,__n,__flags);
    this = (TestNoTailForwarder *)local_a0.node.ptr;
    pSVar4 = local_d0.super_Builder.builder.segment;
    pPVar3 = *(PromiseArena **)&((local_d0.super_Builder.builder.segment)->super_SegmentReader).id;
    if (pPVar3 == (PromiseArena *)0x0 ||
        (ulong)((long)local_d0.super_Builder.builder.segment - (long)pPVar3) < 0x28) {
      pvVar8 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:2122:36)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006e6448;
      *(undefined8 **)((long)pvVar8 + 0x3f8) = in_R8;
      *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
      uVar9 = extraout_RDX;
    }
    else {
      *(PromiseArena **)&((local_d0.super_Builder.builder.segment)->super_SegmentReader).id =
           (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &local_d0.super_Builder.builder.segment[-1].super_SegmentReader.ptr;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:2122:36)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      pSVar4[-1].super_SegmentReader.ptr.ptr = (word *)&PTR_destroy_006e6448;
      *(undefined8 **)&pSVar4[-1].readOnly = in_R8;
      pSVar4[-1].super_SegmentReader.ptr.size_ = (size_t)pPVar3;
      uVar9 = extraout_RDX_00;
    }
    pRVar7 = local_d0.hook.ptr;
    pDVar6 = local_d0.hook.disposer;
    if (local_d0.hook.disposer != (Disposer *)0x0) {
      local_d0.hook.disposer = (Disposer *)0x0;
      local_d0.hook.ptr = (RequestHook *)0x0;
      (**(code **)*local_a8)(local_a8,pDVar6,8,pRVar7,pRVar7,0);
      uVar9 = extraout_RDX_01;
    }
    pWVar5 = local_d0.super_Builder.builder.pointer;
    if (local_d0.super_Builder.builder.pointer != (WirePointer *)0x0) {
      local_d0.super_Builder.builder.pointer = (WirePointer *)0x0;
      (**((local_d0.super_Builder.builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
                (local_d0.super_Builder.builder.capTable,
                 (long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
      uVar9 = extraout_RDX_02;
    }
    pSVar4 = local_d0.super_Builder.builder.segment;
    if (local_d0.super_Builder.builder.segment != (SegmentBuilder *)0x0) {
      local_d0.super_Builder.builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar4);
      uVar9 = extraout_RDX_03;
    }
    pRVar7 = local_78;
    *(TransformPromiseNodeBase **)this = this_00;
    *(undefined2 *)((long)this + 8) = 0;
    if (local_78 != (RequestHook *)0x0) {
      local_78 = (RequestHook *)0x0;
      (**pDStack_80->_vptr_Disposer)
                (pDStack_80,
                 (_func_int *)
                 ((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2]));
      uVar9 = extraout_RDX_04;
    }
  }
  DVar11.isStreaming = (bool)(char)uVar9;
  DVar11.allowCancellation = (bool)(char)((ulong)uVar9 >> 8);
  DVar11._10_6_ = (int6)((ulong)uVar9 >> 0x10);
  DVar11.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar11;
}

Assistant:

DispatchCallResult dispatchCall(uint64_t interfaceId, uint16_t methodId,
                                  CallContext<AnyPointer, AnyPointer> context) override {
    if (interfaceId == capnp::typeId<test::TestMoreStuff>() && methodId == 3) {
      // Calling TestMoreStuff.hold(). Dispatch normally.
      return test::TestMoreStuff::Server::dispatchCall(interfaceId, methodId, context);
    }

    auto params = context.getParams();
    auto req = next.typelessRequest(interfaceId, methodId, params.targetSize(), {});
    req.set(params);
    auto promise = req.send().then([context](Response<AnyPointer> resp) mutable {
      context.getResults(resp.targetSize()).set(resp);
    });
    return { .promise = kj::mv(promise), .isStreaming = false };
  }